

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
jsoncons::detail::optional<std::vector<double,_std::allocator<double>_>_>::swap
          (optional<std::vector<double,_std::allocator<double>_>_> *this,
          optional<std::vector<double,_std::allocator<double>_>_> *other)

{
  bool bVar1;
  bool bVar2;
  optional<std::vector<double,_std::allocator<double>_>_> *this_00;
  optional<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  optional<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  optional<std::vector<double,_std::allocator<double>_>_> *target;
  optional<std::vector<double,_std::allocator<double>_>_> *source;
  bool contains_a_value;
  optional<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  
  bVar1 = has_value(in_RDI);
  bVar2 = has_value(in_RSI);
  if (bVar1 == bVar2) {
    if (bVar1) {
      operator*((optional<std::vector<double,_std::allocator<double>_>_> *)0x96f174);
      operator*((optional<std::vector<double,_std::allocator<double>_>_> *)0x96f185);
      std::swap<double,std::allocator<double>>
                (in_stack_ffffffffffffff80,
                 (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78);
    }
  }
  else {
    this_00 = (optional<std::vector<double,_std::allocator<double>_>_> *)
              operator*((optional<std::vector<double,_std::allocator<double>_>_> *)0x96f1fa);
    optional<std::vector<double,std::allocator<double>>>::
    optional<std::vector<double,std::allocator<double>>&>
              (this_00,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78,0);
    operator=(this_00,in_stack_ffffffffffffff78);
    ~optional((optional<std::vector<double,_std::allocator<double>_>_> *)0x96f22f);
    reset((optional<std::vector<double,_std::allocator<double>_>_> *)0x96f239);
  }
  return;
}

Assistant:

void swap(optional& other) noexcept(std::is_nothrow_move_constructible<T>::value /*&&
                                            std::is_nothrow_swappable<T>::value*/)
        {
            const bool contains_a_value = has_value();
            if (contains_a_value == other.has_value())
            {
                if (contains_a_value)
                {
                    using std::swap;
                    swap(**this, *other);
                }
            }
            else
            {
                optional& source = contains_a_value ? *this : other;
                optional& target = contains_a_value ? other : *this;
                target = optional<T>(*source);
                source.reset();
            }
        }